

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall
cmGraphVizWriter::FindAllConnections
          (cmGraphVizWriter *this,ConnectionsMap *connectionMap,cmLinkItem *rootItem,
          Connections *extendedCons,
          set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *visitedItems)

{
  bool bVar1;
  mapped_type *this_00;
  _Self local_88;
  _Self local_80;
  undefined1 local_71;
  key_type *pkStack_70;
  bool visited;
  cmLinkItem *dstItem;
  Connection *con;
  const_iterator __end1;
  const_iterator __begin1;
  Connections *__range1;
  Connections *origCons;
  _Self local_38;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *local_30;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *visitedItems_local;
  Connections *extendedCons_local;
  cmLinkItem *rootItem_local;
  ConnectionsMap *connectionMap_local;
  cmGraphVizWriter *this_local;
  
  local_30 = visitedItems;
  visitedItems_local =
       (set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)extendedCons;
  extendedCons_local = (Connections *)rootItem;
  rootItem_local = (cmLinkItem *)connectionMap;
  connectionMap_local = (ConnectionsMap *)this;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
       ::find(connectionMap,rootItem);
  origCons = (Connections *)
             std::
             map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
             ::cend((map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                     *)rootItem_local);
  bVar1 = std::operator==(&local_38,(_Self *)&origCons);
  if (!bVar1) {
    this_00 = std::
              map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
              ::at((map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                    *)rootItem_local,(key_type *)extendedCons_local);
    __end1 = std::
             vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>::
             begin(this_00);
    con = (Connection *)
          std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>::
          end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmGraphVizWriter::Connection_*,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>
                                       *)&con), bVar1) {
      dstItem = &__gnu_cxx::
                 __normal_iterator<const_cmGraphVizWriter::Connection_*,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>
                 ::operator*(&__end1)->src;
      std::vector<cmGraphVizWriter::Connection,std::allocator<cmGraphVizWriter::Connection>>::
      emplace_back<cmGraphVizWriter::Connection_const&>
                ((vector<cmGraphVizWriter::Connection,std::allocator<cmGraphVizWriter::Connection>>
                  *)visitedItems_local,(Connection *)dstItem);
      pkStack_70 = dstItem + 1;
      local_80._M_node =
           (_Base_ptr)
           std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::find
                     (local_30,pkStack_70);
      local_88._M_node =
           (_Base_ptr)
           std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::cend(local_30);
      local_71 = std::operator!=(&local_80,&local_88);
      if (!(bool)local_71) {
        std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                  (local_30,pkStack_70);
        FindAllConnections(this,(ConnectionsMap *)rootItem_local,pkStack_70,
                           (Connections *)visitedItems_local,local_30);
      }
      __gnu_cxx::
      __normal_iterator<const_cmGraphVizWriter::Connection_*,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::FindAllConnections(const ConnectionsMap& connectionMap,
                                          const cmLinkItem& rootItem,
                                          Connections& extendedCons,
                                          std::set<cmLinkItem>& visitedItems)
{
  // some "targets" are not in map, e.g. linker flags as -lm or
  // targets without dependency.
  // in both cases we are finished with traversing the graph
  if (connectionMap.find(rootItem) == connectionMap.cend()) {
    return;
  }

  const Connections& origCons = connectionMap.at(rootItem);

  for (const Connection& con : origCons) {
    extendedCons.emplace_back(con);
    const cmLinkItem& dstItem = con.dst;
    bool const visited = visitedItems.find(dstItem) != visitedItems.cend();
    if (!visited) {
      visitedItems.insert(dstItem);
      this->FindAllConnections(connectionMap, dstItem, extendedCons,
                               visitedItems);
    }
  }
}